

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t * Aig_ManSupportsInverse(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_02;
  int iOut;
  int iIn;
  int k;
  int i;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *vSuppsInv;
  Vec_Ptr_t *vSupps;
  Aig_Man_t *p_local;
  
  p_00 = Aig_ManSupports(p);
  iVar1 = Aig_ManCiNum(p);
  p_01 = Vec_PtrAlloc(iVar1);
  for (iIn = 0; iVar1 = Aig_ManCiNum(p), iIn < iVar1; iIn = iIn + 1) {
    pVVar3 = Vec_IntAlloc(8);
    Vec_PtrPush(p_01,pVVar3);
  }
  for (iIn = 0; iVar1 = Vec_PtrSize(p_00), iIn < iVar1; iIn = iIn + 1) {
    pVVar3 = (Vec_Int_t *)Vec_PtrEntry(p_00,iIn);
    iVar1 = Vec_IntPop(pVVar3);
    for (iOut = 0; iVar2 = Vec_IntSize(pVVar3), iOut < iVar2; iOut = iOut + 1) {
      iVar2 = Vec_IntEntry(pVVar3,iOut);
      p_02 = (Vec_Int_t *)Vec_PtrEntry(p_01,iVar2);
      Vec_IntPush(p_02,iVar1);
    }
  }
  Vec_VecFree((Vec_Vec_t *)p_00);
  return p_01;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsInverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupps, * vSuppsInv;
    Vec_Int_t * vSupp;
    int i, k, iIn, iOut;
    // get structural supports for each output
    vSupps = Aig_ManSupports( p );
    // start the inverse supports
    vSuppsInv = Vec_PtrAlloc( Aig_ManCiNum(p) );
    for ( i = 0; i < Aig_ManCiNum(p); i++ )
        Vec_PtrPush( vSuppsInv, Vec_IntAlloc(8) );
    // transforms the supports into the inverse supports
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vSupp, i )
    {
        iOut = Vec_IntPop( vSupp );
        Vec_IntForEachEntry( vSupp, iIn, k )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vSuppsInv, iIn), iOut );
    }
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    return vSuppsInv;
}